

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventReportPdu.cpp
# Opt level: O2

void __thiscall DIS::EventReportPdu::EventReportPdu(EventReportPdu *this)

{
  SimulationManagementFamilyPdu::SimulationManagementFamilyPdu
            (&this->super_SimulationManagementFamilyPdu);
  (this->super_SimulationManagementFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__EventReportPdu_001b0f68;
  this->_eventType = 0;
  this->_padding1 = 0;
  this->_numberOfFixedDatumRecords = 0;
  this->_numberOfVariableDatumRecords = 0;
  (this->_fixedDatums).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fixedDatums).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fixedDatums).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_variableDatums).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_variableDatums).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_variableDatums).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Pdu::setPduType((Pdu *)this,'\x15');
  return;
}

Assistant:

EventReportPdu::EventReportPdu() : SimulationManagementFamilyPdu(),
   _eventType(0), 
   _padding1(0), 
   _numberOfFixedDatumRecords(0), 
   _numberOfVariableDatumRecords(0)
{
    setPduType( 21 );
}